

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O3

void __thiscall QFontDialog::done(QFontDialog *this,int result)

{
  QFont *this_00;
  undefined4 uVar1;
  long lVar2;
  void *pvVar3;
  long lVar4;
  int *piVar5;
  char cVar6;
  char *pcVar7;
  QObject *pQVar8;
  QFont *this_01;
  long in_FS_OFFSET;
  undefined1 local_58 [16];
  void *local_48;
  QFont *local_40;
  long local_30;
  
  this_01 = (QFont *)local_58;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  if (result == 1) {
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    currentFont((QFontDialog *)local_58);
    this_00 = (QFont *)(lVar2 + 0x3d0);
    cVar6 = QFont::operator!=((QFont *)local_58,this_00);
    if (cVar6 != '\0') {
      local_48 = (void *)0x0;
      local_40 = (QFont *)local_58;
      QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_48);
    }
    QFont::operator=(this_00,(QFont *)local_58);
    local_48 = (void *)0x0;
    local_40 = this_00;
    QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_48);
  }
  else {
    this_01 = (QFont *)&local_48;
    QFont::QFont(this_01);
    pvVar3 = *(void **)(lVar2 + 0x3d0);
    *(void **)(lVar2 + 0x3d0) = local_48;
    uVar1 = *(undefined4 *)(lVar2 + 0x3d8);
    *(undefined4 *)(lVar2 + 0x3d8) = local_40._0_4_;
    local_40 = (QFont *)CONCAT44(local_40._4_4_,uVar1);
    local_48 = pvVar3;
  }
  QFont::~QFont(this_01);
  lVar4 = *(long *)(lVar2 + 0x3f0);
  if (((lVar4 != 0) && (*(int *)(lVar4 + 4) != 0)) &&
     (*(QObject **)(lVar2 + 0x3f8) != (QObject *)0x0)) {
    pQVar8 = *(QObject **)(lVar2 + 0x3f8);
    if (*(int *)(lVar4 + 4) == 0) {
      pQVar8 = (QObject *)0x0;
    }
    pcVar7 = *(char **)(lVar2 + 0x408);
    if (pcVar7 == (char *)0x0) {
      pcVar7 = (char *)&QByteArray::_empty;
    }
    QObject::disconnect((QObject *)this,"2fontSelected(QFont)",pQVar8,pcVar7);
    piVar5 = *(int **)(lVar2 + 0x3f0);
    *(undefined8 *)(lVar2 + 0x3f0) = 0;
    *(undefined8 *)(lVar2 + 0x3f8) = 0;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        operator_delete(piVar5);
      }
    }
  }
  QByteArray::clear();
  QDialog::done(&this->super_QDialog,result);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontDialog::done(int result)
{
    Q_D(QFontDialog);
    if (result == Accepted) {
        // We check if this is the same font we had before, if so we emit currentFontChanged
        QFont selectedFont = currentFont();
        if (selectedFont != d->selectedFont)
            emit(currentFontChanged(selectedFont));
        d->selectedFont = selectedFont;
        emit fontSelected(d->selectedFont);
    } else
        d->selectedFont = QFont();
    if (d->receiverToDisconnectOnClose) {
        disconnect(this, SIGNAL(fontSelected(QFont)),
                   d->receiverToDisconnectOnClose, d->memberToDisconnectOnClose);
        d->receiverToDisconnectOnClose = nullptr;
    }
    d->memberToDisconnectOnClose.clear();
    QDialog::done(result);
}